

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_partitioner.hpp
# Opt level: O2

bool __thiscall
oqpi::simple_partitioner::getNextValidRange
          (simple_partitioner *this,int32_t *fromIndex,int32_t *toIndex)

{
  atomic<int> *paVar1;
  int32_t batchIndex;
  int iVar2;
  int32_t iVar3;
  
  LOCK();
  paVar1 = &this->batchIndex_;
  batchIndex = (paVar1->super___atomic_base<int>)._M_i;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  iVar2 = (this->super_base_partitioner).batchCount_;
  if (batchIndex < iVar2) {
    iVar3 = firstIndexOfBatch(this,batchIndex);
    *fromIndex = iVar3;
    iVar3 = lastIndexOfBatch(this,batchIndex);
    *toIndex = iVar3;
  }
  return batchIndex < iVar2;
}

Assistant:

inline bool getNextValidRange(int32_t &fromIndex, int32_t &toIndex)
        {
            const auto batchIndex = batchIndex_++;
            if (batchIndex >= batchCount_)
            {
                // All batches have been processed
                return false;
            }
            
            // Return the range [fromIndex; toIndex[
            fromIndex = firstIndexOfBatch(batchIndex);
            toIndex   = lastIndexOfBatch(batchIndex);

            return true;
        }